

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

long SSL_get_verify_result(SSL *ssl)

{
  SSL_SESSION *pSVar1;
  SSL_SESSION *session;
  SSL *ssl_local;
  
  bssl::check_ssl_x509_method((SSL *)ssl);
  pSVar1 = SSL_get_session(ssl);
  if (pSVar1 == (SSL_SESSION *)0x0) {
    ssl_local = (SSL *)0x41;
  }
  else {
    ssl_local = *(SSL **)(pSVar1->krb5_client_princ + 0x30);
  }
  return (long)ssl_local;
}

Assistant:

long SSL_get_verify_result(const SSL *ssl) {
  check_ssl_x509_method(ssl);
  SSL_SESSION *session = SSL_get_session(ssl);
  if (session == NULL) {
    return X509_V_ERR_INVALID_CALL;
  }
  return session->verify_result;
}